

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

string_view __thiscall
libtorrent::bdecode_node::list_string_value_at(bdecode_node *this,int i,string_view default_val)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  string_view sVar6;
  bdecode_node n;
  bdecode_node local_58;
  
  pcVar5 = default_val._M_str;
  sVar4 = default_val._M_len;
  list_at(&local_58,this,i);
  lVar2 = (long)local_58.m_token_idx;
  if ((lVar2 != -1) &&
     ((*(uint *)(local_58.m_root_tokens + lVar2) >> 0x1d == 5 ||
      (*(uint *)(local_58.m_root_tokens + lVar2) >> 0x1d == 3)))) {
    uVar1 = SUB84(local_58.m_root_tokens[lVar2],0);
    uVar3 = (SUB84(local_58.m_root_tokens[lVar2],4) >> 0x1d) +
            (uint)((uVar1 & 0xe0000000) != 0x60000000) * 8;
    sVar4 = (size_t)(int)(((*(uint *)(local_58.m_root_tokens + lVar2 + 1) & 0x1fffffff) -
                          ((uVar1 & 0x1fffffff) + uVar3)) + -2);
    pcVar5 = local_58.m_buffer + (ulong)uVar3 + (ulong)(uVar1 & 0x1fffffff) + 2;
  }
  if (local_58.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar6._M_str = pcVar5;
  sVar6._M_len = sVar4;
  return sVar6;
}

Assistant:

string_view bdecode_node::list_string_value_at(int i
		, string_view default_val) const
	{
		bdecode_node const n = list_at(i);
		if (n.type() != bdecode_node::string_t) return default_val;
		return n.string_value();
	}